

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O2

void __thiscall
bssl::HPKETest_X25519EncapSmallOrderPoint_Test::TestBody
          (HPKETest_X25519EncapSmallOrderPoint_Test *this)

{
  code *pcVar1;
  int iVar2;
  EVP_HPKE_KEM *pEVar3;
  EVP_HPKE_KDF *pEVar4;
  EVP_HPKE_AEAD *pEVar5;
  long lVar6;
  char *in_R9;
  char *pcVar7;
  ScopedTrace gtest_trace_489;
  ScopedTrace gtest_trace_487;
  AssertionResult gtest_ar__3;
  AssertHelper local_698;
  AssertionResult gtest_ar__1;
  AssertHelper local_670;
  long local_668;
  size_t enc_len;
  uint8_t enc [32];
  ScopedEVP_HPKE_KEY key;
  ScopedEVP_HPKE_CTX sender_ctx;
  AssertionResult gtest_ar_;
  
  EVP_HPKE_KEY_zero(&key.ctx_);
  pEVar3 = EVP_hpke_x25519_hkdf_sha256();
  iVar2 = EVP_HPKE_KEY_generate(&key.ctx_,pEVar3);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = iVar2 != 0;
  if (iVar2 == 0) {
    testing::Message::Message((Message *)enc);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sender_ctx,(internal *)&gtest_ar_,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x1e4,(char *)CONCAT62(sender_ctx.ctx_.kem._2_6_,(uint16_t)sender_ctx.ctx_.kem));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)enc);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    std::__cxx11::string::~string((string *)&sender_ctx);
    if (enc._0_8_ != 0) {
      (**(code **)(*(long *)enc._0_8_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    lVar6 = 0;
    while (lVar6 != 8) {
      local_668 = lVar6;
      pEVar4 = EVP_hpke_hkdf_sha256();
      sender_ctx.ctx_.kem._0_2_ = EVP_HPKE_KDF_id(pEVar4);
      testing::ScopedTrace::ScopedTrace<unsigned_short>
                (&gtest_trace_487,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                 ,0x1e7,(unsigned_short *)&sender_ctx);
      for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 8) {
        pcVar1 = *(code **)((long)&(anonymous_namespace)::kAllAEADs + lVar6);
        pEVar5 = (EVP_HPKE_AEAD *)(*pcVar1)();
        sender_ctx.ctx_.kem._0_2_ = EVP_HPKE_AEAD_id(pEVar5);
        testing::ScopedTrace::ScopedTrace<unsigned_short>
                  (&gtest_trace_489,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                   ,0x1e9,(unsigned_short *)&sender_ctx);
        EVP_HPKE_CTX_zero(&sender_ctx.ctx_);
        pEVar3 = EVP_hpke_x25519_hkdf_sha256();
        pEVar4 = EVP_hpke_hkdf_sha256();
        pEVar5 = (EVP_HPKE_AEAD *)(*pcVar1)();
        iVar2 = EVP_HPKE_CTX_setup_sender
                          (&sender_ctx.ctx_,enc,&enc_len,0x20,pEVar3,pEVar4,pEVar5,
                           TestBody::kSmallOrderPoint,0x20,(uint8_t *)0x0,0);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar2 == 0;
        if (!gtest_ar__1.success_) {
          testing::Message::Message((Message *)&gtest_ar__3);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)
                     "EVP_HPKE_CTX_setup_sender( sender_ctx.get(), enc, &enc_len, sizeof(enc), EVP_hpke_x25519_hkdf_sha256(), kdf(), aead(), kSmallOrderPoint, sizeof(kSmallOrderPoint), nullptr, 0)"
                     ,"true","false",(char *)pEVar4);
          testing::internal::AssertHelper::AssertHelper
                    (&local_698,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                     ,0x1f1,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
          testing::internal::AssertHelper::operator=(&local_698,(Message *)&gtest_ar__3);
          testing::internal::AssertHelper::~AssertHelper(&local_698);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          if ((long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        pEVar4 = EVP_hpke_hkdf_sha256();
        pEVar5 = (EVP_HPKE_AEAD *)(*pcVar1)();
        iVar2 = EVP_HPKE_CTX_setup_auth_sender
                          (&sender_ctx.ctx_,enc,&enc_len,0x20,&key.ctx_,pEVar4,pEVar5,
                           TestBody::kSmallOrderPoint,0x20,(uint8_t *)0x0,0);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar2 == 0;
        if (!gtest_ar__1.success_) {
          testing::Message::Message((Message *)&gtest_ar__3);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)
                     "EVP_HPKE_CTX_setup_auth_sender( sender_ctx.get(), enc, &enc_len, sizeof(enc), key.get(), kdf(), aead(), kSmallOrderPoint, sizeof(kSmallOrderPoint), nullptr, 0)"
                     ,"true","false",(char *)pEVar4);
          testing::internal::AssertHelper::AssertHelper
                    (&local_698,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                     ,0x1f6,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
          testing::internal::AssertHelper::operator=(&local_698,(Message *)&gtest_ar__3);
          testing::internal::AssertHelper::~AssertHelper(&local_698);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          if ((long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        EVP_HPKE_CTX_zero((EVP_HPKE_CTX *)&gtest_ar_);
        pEVar4 = EVP_hpke_hkdf_sha256();
        pEVar5 = (EVP_HPKE_AEAD *)(*pcVar1)();
        pcVar7 = &DAT_00000020;
        iVar2 = EVP_HPKE_CTX_setup_recipient
                          ((EVP_HPKE_CTX *)&gtest_ar_,&key.ctx_,pEVar4,pEVar5,
                           TestBody::kSmallOrderPoint,0x20,(uint8_t *)0x0,0);
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__3.success_ = iVar2 == 0;
        if (!gtest_ar__3.success_) {
          testing::Message::Message((Message *)&local_698);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__1,(internal *)&gtest_ar__3,
                     (AssertionResult *)
                     "EVP_HPKE_CTX_setup_recipient( recipient_ctx.get(), key.get(), kdf(), aead(), kSmallOrderPoint, sizeof(kSmallOrderPoint), nullptr, 0)"
                     ,"true","false",pcVar7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_670,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                     ,0x1fc,(char *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_));
          testing::internal::AssertHelper::operator=(&local_670,(Message *)&local_698);
          testing::internal::AssertHelper::~AssertHelper(&local_670);
          std::__cxx11::string::~string((string *)&gtest_ar__1);
          if (local_698.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_698.data_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__3.message_);
        pEVar4 = EVP_hpke_hkdf_sha256();
        pEVar5 = (EVP_HPKE_AEAD *)(*pcVar1)();
        pcVar7 = &DAT_00000020;
        iVar2 = EVP_HPKE_CTX_setup_auth_recipient
                          ((EVP_HPKE_CTX *)&gtest_ar_,&key.ctx_,pEVar4,pEVar5,
                           TestBody::kSmallOrderPoint,0x20,(uint8_t *)0x0,0,TestBody::kValidPoint,
                           0x20);
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__3.success_ = iVar2 == 0;
        if (!gtest_ar__3.success_) {
          testing::Message::Message((Message *)&local_698);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__1,(internal *)&gtest_ar__3,
                     (AssertionResult *)
                     "EVP_HPKE_CTX_setup_auth_recipient( recipient_ctx.get(), key.get(), kdf(), aead(), kSmallOrderPoint, sizeof(kSmallOrderPoint), nullptr, 0, kValidPoint, sizeof(kValidPoint))"
                     ,"true","false",pcVar7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_670,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                     ,0x203,(char *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_));
          testing::internal::AssertHelper::operator=(&local_670,(Message *)&local_698);
          testing::internal::AssertHelper::~AssertHelper(&local_670);
          std::__cxx11::string::~string((string *)&gtest_ar__1);
          if (local_698.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_698.data_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__3.message_);
        pEVar4 = EVP_hpke_hkdf_sha256();
        pEVar5 = (EVP_HPKE_AEAD *)(*pcVar1)();
        pcVar7 = &DAT_00000020;
        iVar2 = EVP_HPKE_CTX_setup_auth_recipient
                          ((EVP_HPKE_CTX *)&gtest_ar_,&key.ctx_,pEVar4,pEVar5,TestBody::kValidPoint,
                           0x20,(uint8_t *)0x0,0,TestBody::kSmallOrderPoint,0x20);
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__3.success_ = iVar2 == 0;
        if (!gtest_ar__3.success_) {
          testing::Message::Message((Message *)&local_698);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__1,(internal *)&gtest_ar__3,
                     (AssertionResult *)
                     "EVP_HPKE_CTX_setup_auth_recipient( recipient_ctx.get(), key.get(), kdf(), aead(), kValidPoint, sizeof(kValidPoint), nullptr, 0, kSmallOrderPoint, sizeof(kSmallOrderPoint))"
                     ,"true","false",pcVar7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_670,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                     ,0x207,(char *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_));
          testing::internal::AssertHelper::operator=(&local_670,(Message *)&local_698);
          testing::internal::AssertHelper::~AssertHelper(&local_670);
          std::__cxx11::string::~string((string *)&gtest_ar__1);
          if (local_698.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_698.data_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__3.message_);
        internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
        ~StackAllocated((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                         *)&gtest_ar_);
        internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
        ~StackAllocated(&sender_ctx);
        testing::ScopedTrace::~ScopedTrace(&gtest_trace_489);
      }
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_487);
      lVar6 = local_668 + 8;
    }
  }
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::~StackAllocatedMovable(&key);
  return;
}

Assistant:

TEST(HPKETest, X25519EncapSmallOrderPoint) {
  // Borrowed from X25519Test.SmallOrder.
  static const uint8_t kSmallOrderPoint[32] = {
      0xe0, 0xeb, 0x7a, 0x7c, 0x3b, 0x41, 0xb8, 0xae, 0x16, 0x56, 0xe3,
      0xfa, 0xf1, 0x9f, 0xc4, 0x6a, 0xda, 0x09, 0x8d, 0xeb, 0x9c, 0x32,
      0xb1, 0xfd, 0x86, 0x62, 0x05, 0x16, 0x5f, 0x49, 0xb8,
  };
  static const uint8_t kValidPoint[32] = {
      0xe6, 0xdb, 0x68, 0x67, 0x58, 0x30, 0x30, 0xdb, 0x35, 0x94, 0xc1,
      0xa4, 0x24, 0xb1, 0x5f, 0x7c, 0x72, 0x66, 0x24, 0xec, 0x26, 0xb3,
      0x35, 0x3b, 0x10, 0xa9, 0x03, 0xa6, 0xd0, 0xab, 0x1c, 0x4c,
  };

  ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));

  for (const auto kdf : kAllKDFs) {
    SCOPED_TRACE(EVP_HPKE_KDF_id(kdf()));
    for (const auto aead : kAllAEADs) {
      SCOPED_TRACE(EVP_HPKE_AEAD_id(aead()));
      // Set up the sender, passing in kSmallOrderPoint as |peer_public_key|.
      ScopedEVP_HPKE_CTX sender_ctx;
      uint8_t enc[X25519_PUBLIC_VALUE_LEN];
      size_t enc_len;
      EXPECT_FALSE(EVP_HPKE_CTX_setup_sender(
          sender_ctx.get(), enc, &enc_len, sizeof(enc),
          EVP_hpke_x25519_hkdf_sha256(), kdf(), aead(), kSmallOrderPoint,
          sizeof(kSmallOrderPoint), nullptr, 0));

      // Likewise with auth.
      EXPECT_FALSE(EVP_HPKE_CTX_setup_auth_sender(
          sender_ctx.get(), enc, &enc_len, sizeof(enc), key.get(), kdf(),
          aead(), kSmallOrderPoint, sizeof(kSmallOrderPoint), nullptr, 0));

      // Set up the recipient, passing in kSmallOrderPoint as |enc|.
      ScopedEVP_HPKE_CTX recipient_ctx;
      EXPECT_FALSE(EVP_HPKE_CTX_setup_recipient(
          recipient_ctx.get(), key.get(), kdf(), aead(), kSmallOrderPoint,
          sizeof(kSmallOrderPoint), nullptr, 0));

      // Likewise with auth. With auth, a small-order point could appear as
      // either |enc| or the peer public key.
      EXPECT_FALSE(EVP_HPKE_CTX_setup_auth_recipient(
          recipient_ctx.get(), key.get(), kdf(), aead(), kSmallOrderPoint,
          sizeof(kSmallOrderPoint), nullptr, 0, kValidPoint,
          sizeof(kValidPoint)));
      EXPECT_FALSE(EVP_HPKE_CTX_setup_auth_recipient(
          recipient_ctx.get(), key.get(), kdf(), aead(), kValidPoint,
          sizeof(kValidPoint), nullptr, 0, kSmallOrderPoint,
          sizeof(kSmallOrderPoint)));
    }
  }
}